

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::WeakFulfiller<capnproto_test::capnp::test::TestCallOrder::Client>::disposeImpl
          (WeakFulfiller<capnproto_test::capnp::test::TestCallOrder::Client> *this)

{
  void *in_RSI;
  
  disposeImpl((WeakFulfiller<capnproto_test::capnp::test::TestCallOrder::Client> *)&this[-1].inner,
              in_RSI);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    // TODO(perf): Factor some of this out so it isn't regenerated for every fulfiller type?

    if (inner == nullptr) {
      // Already detached.
      delete this;
    } else {
      if (inner->isWaiting()) {
        inner->reject(kj::Exception(kj::Exception::Type::FAILED, __FILE__, __LINE__,
            kj::heapString("PromiseFulfiller was destroyed without fulfilling the promise.")));
      }
      inner = nullptr;
    }
  }